

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O3

size_t light_get_size(light_pcapng pcapng)

{
  size_t sVar1;
  
  sVar1 = 0;
  for (; pcapng != (light_pcapng)0x0; pcapng = pcapng->next_block) {
    sVar1 = sVar1 + pcapng->block_total_lenght;
  }
  return sVar1;
}

Assistant:

size_t light_get_size(const light_pcapng pcapng)
{
	light_pcapng iterator = pcapng;
	size_t size = 0;

	while (iterator != NULL) {
		size += iterator->block_total_lenght;
		iterator = iterator->next_block;
	}

	return size;
}